

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# notch.hpp
# Opt level: O3

void __thiscall notch::core::Net::clear(Net *this)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  
  std::
  vector<std::shared_ptr<notch::core::ABackpropLayer>,_std::allocator<std::shared_ptr<notch::core::ABackpropLayer>_>_>
  ::clear(&this->layers);
  this_00 = (this->lossLayer).
            super___shared_ptr<notch::core::ALossLayer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi;
  (this->lossLayer).super___shared_ptr<notch::core::ALossLayer,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->lossLayer).super___shared_ptr<notch::core::ALossLayer,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
    return;
  }
  return;
}

Assistant:

virtual void clear() {
        layers.clear();
        lossLayer = nullptr;
    }